

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::timestamp_t,duckdb::date_t,duckdb::UnaryOperatorWrapper,duckdb::CastTimestampMsToDate>
               (timestamp_t *ldata,date_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  date_t dVar1;
  idx_t iVar2;
  ulong uVar3;
  idx_t i;
  idx_t row_idx;
  ulong uVar4;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
      uVar3 = uVar4;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)sel_vector->sel_vector[uVar4];
      }
      dVar1 = CastTimestampMsToDate::Operation<duckdb::timestamp_t,duckdb::date_t>
                        ((timestamp_t)ldata[uVar3].value);
      result_data[uVar4].days = dVar1.days;
    }
  }
  else {
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      iVar2 = row_idx;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar2 = (idx_t)sel_vector->sel_vector[row_idx];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar2 >> 6] >>
           (iVar2 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
      else {
        dVar1 = CastTimestampMsToDate::Operation<duckdb::timestamp_t,duckdb::date_t>
                          ((timestamp_t)ldata[iVar2].value);
        result_data[row_idx].days = dVar1.days;
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}